

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::ResolveLanguageCompiler
          (cmGlobalGenerator *this,string *lang,cmMakefile *mf,bool optional)

{
  cmState *pcVar1;
  bool bVar2;
  cmValue cVar3;
  string *in_name;
  allocator<char> local_f9;
  string path;
  string local_d8;
  string changeVars;
  string cnameString;
  cmList cnameArgList;
  string pathString;
  string langComp;
  
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[10]>
            (&langComp,(char (*) [7])0x7a0538,lang,(char (*) [10])0x796953);
  cVar3 = cmMakefile::GetDefinition(mf,&langComp);
  if (cVar3.Value == (string *)0x0) {
    if (optional) goto LAB_002b6f9b;
    cmStrCat<std::__cxx11::string&,char_const(&)[31]>
              (&path,&langComp,(char (*) [31])" not set, after EnableLanguage");
    cmSystemTools::Error(&path);
  }
  else {
    in_name = cmMakefile::GetRequiredDefinition(mf,&langComp);
    path._M_dataplus._M_p = (pointer)&path.field_2;
    path._M_string_length = 0;
    path.field_2._M_local_buf[0] = '\0';
    bVar2 = cmsys::SystemTools::FileIsFullPath(in_name);
    if (bVar2) {
      std::__cxx11::string::_M_assign((string *)&path);
    }
    else {
      cnameString._M_dataplus._M_p = (pointer)0x0;
      cnameString._M_string_length = 0;
      cnameString.field_2._M_allocated_capacity = 0;
      cmsys::SystemTools::FindProgram
                (&changeVars,in_name,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&cnameString,false);
      std::__cxx11::string::operator=((string *)&path,(string *)&changeVars);
      std::__cxx11::string::~string((string *)&changeVars);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cnameString);
    }
    if (optional) {
LAB_002b6d60:
      cVar3 = cmState::GetInitializedCacheValue
                        ((this->CMakeInstance->State)._M_t.
                         super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                         super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                         super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&langComp);
      cnameArgList.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      cnameArgList.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      cnameArgList.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (cVar3.Value == (string *)0x0) {
        cVar3.Value = (string *)0x0;
      }
      else if ((cVar3.Value)->_M_string_length != 0) {
        cmList::assign(&cnameArgList,cVar3.Value,Yes,No);
        cVar3.Value = cnameArgList.Values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
      }
      changeVars._M_dataplus._M_p = (pointer)&changeVars.field_2;
      changeVars._M_string_length = 0;
      changeVars.field_2._M_local_buf[0] = '\0';
      if (cVar3.Value != (string *)0x0 && !optional) {
        cnameString._M_dataplus._M_p = (pointer)&cnameString.field_2;
        cnameString._M_string_length = 0;
        cnameString.field_2._M_allocated_capacity =
             cnameString.field_2._M_allocated_capacity & 0xffffffffffffff00;
        bVar2 = cmsys::SystemTools::FileIsFullPath(cVar3.Value);
        if (bVar2) {
          std::__cxx11::string::_M_assign((string *)&cnameString);
        }
        else {
          local_d8._M_dataplus._M_p = (pointer)0x0;
          local_d8._M_string_length = 0;
          local_d8.field_2._M_allocated_capacity = 0;
          cmsys::SystemTools::FindProgram
                    (&pathString,cVar3.Value,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_d8,false);
          std::__cxx11::string::operator=((string *)&cnameString,(string *)&pathString);
          std::__cxx11::string::~string((string *)&pathString);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_d8);
        }
        std::__cxx11::string::string((string *)&pathString,(string *)&path);
        cmsys::SystemTools::ConvertToUnixSlashes(&cnameString);
        cmsys::SystemTools::ConvertToUnixSlashes(&pathString);
        bVar2 = std::operator!=(&cnameString,&pathString);
        if (bVar2) {
          pcVar1 = (this->CMakeInstance->State)._M_t.
                   super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                   super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                   super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d8,"__CMAKE_DELETE_CACHE_CHANGE_VARS_",&local_f9);
          cVar3 = cmState::GetGlobalProperty(pcVar1,&local_d8);
          std::__cxx11::string::~string((string *)&local_d8);
          if (cVar3.Value != (string *)0x0) {
            std::__cxx11::string::append((string *)&changeVars);
            std::__cxx11::string::append((char *)&changeVars);
          }
          std::__cxx11::string::append((string *)&changeVars);
          std::__cxx11::string::append((char *)&changeVars);
          std::__cxx11::string::append((string *)&changeVars);
          pcVar1 = (this->CMakeInstance->State)._M_t.
                   super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                   super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                   super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d8,"__CMAKE_DELETE_CACHE_CHANGE_VARS_",&local_f9);
          cmState::SetGlobalProperty(pcVar1,&local_d8,&changeVars);
          std::__cxx11::string::~string((string *)&local_d8);
        }
        std::__cxx11::string::~string((string *)&pathString);
        std::__cxx11::string::~string((string *)&cnameString);
      }
      std::__cxx11::string::~string((string *)&changeVars);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&cnameArgList.Values);
    }
    else if (path._M_string_length != 0) {
      bVar2 = cmsys::SystemTools::FileExists(&path);
      if (bVar2) goto LAB_002b6d60;
    }
  }
  std::__cxx11::string::~string((string *)&path);
LAB_002b6f9b:
  std::__cxx11::string::~string((string *)&langComp);
  return;
}

Assistant:

void cmGlobalGenerator::ResolveLanguageCompiler(const std::string& lang,
                                                cmMakefile* mf,
                                                bool optional) const
{
  std::string langComp = cmStrCat("CMAKE_", lang, "_COMPILER");

  if (!mf->GetDefinition(langComp)) {
    if (!optional) {
      cmSystemTools::Error(
        cmStrCat(langComp, " not set, after EnableLanguage"));
    }
    return;
  }
  std::string const& name = mf->GetRequiredDefinition(langComp);
  std::string path;
  if (!cmSystemTools::FileIsFullPath(name)) {
    path = cmSystemTools::FindProgram(name);
  } else {
    path = name;
  }
  if (!optional && (path.empty() || !cmSystemTools::FileExists(path))) {
    return;
  }
  cmValue cname =
    this->GetCMakeInstance()->GetState()->GetInitializedCacheValue(langComp);

  // Split compiler from arguments
  cmList cnameArgList;
  if (cname && !cname->empty()) {
    cnameArgList.assign(*cname);
    cname = cmValue(cnameArgList.front());
  }

  std::string changeVars;
  if (cname && !optional) {
    std::string cnameString;
    if (!cmSystemTools::FileIsFullPath(*cname)) {
      cnameString = cmSystemTools::FindProgram(*cname);
    } else {
      cnameString = *cname;
    }
    std::string pathString = path;
    // get rid of potentially multiple slashes:
    cmSystemTools::ConvertToUnixSlashes(cnameString);
    cmSystemTools::ConvertToUnixSlashes(pathString);
    if (cnameString != pathString) {
      cmValue cvars = this->GetCMakeInstance()->GetState()->GetGlobalProperty(
        "__CMAKE_DELETE_CACHE_CHANGE_VARS_");
      if (cvars) {
        changeVars += *cvars;
        changeVars += ";";
      }
      changeVars += langComp;
      changeVars += ";";
      changeVars += *cname;
      this->GetCMakeInstance()->GetState()->SetGlobalProperty(
        "__CMAKE_DELETE_CACHE_CHANGE_VARS_", changeVars);
    }
  }
}